

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emle.c
# Opt level: O0

double fas154x_seas(double *b,int pq,void *params)

{
  double *phi_00;
  double *theta_00;
  double *A_00;
  double *P_00;
  double *V_00;
  int iVar1;
  int iVar2;
  double dVar3;
  double dVar4;
  xlik_object obj;
  double *reg;
  double *V;
  double *P;
  double *A;
  double *theta;
  double *phi;
  int local_b8;
  int iter;
  int nit;
  int iupd;
  int N;
  int ifault;
  int np;
  int j;
  int i;
  int ir;
  int iq;
  int ip;
  int M;
  int naram;
  int offset;
  int s;
  int qs;
  int ps;
  int q;
  int p;
  double temp;
  double delta;
  double sumlog;
  double ssq;
  double value;
  void *params_local;
  double *pdStack_38;
  int pq_local;
  double *b_local;
  
  delta = 0.0;
  sumlog = 0.0;
  ssq = 0.0;
  ir = *params + *(int *)((long)params + 0xc) * *(int *)((long)params + 0x10);
  i = *(int *)((long)params + 8) + *(int *)((long)params + 0xc) * *(int *)((long)params + 0x18);
  j = *(int *)((long)params + 0x1c);
  nit = *(int *)((long)params + 0x28);
  ps = *params;
  s = *(int *)((long)params + 0x10);
  qs = *(int *)((long)params + 8);
  offset = *(int *)((long)params + 0x18);
  iq = *(int *)((long)params + 0x2c);
  naram = *(int *)((long)params + 0xc);
  M = *(int *)((long)params + 0x50);
  N = (j * (j + 1)) / 2;
  ip = ps + qs + s + offset;
  iVar1 = M + nit * 3;
  value = (double)params;
  params_local._4_4_ = pq;
  pdStack_38 = b;
  phi_00 = (double *)malloc((long)j << 3);
  theta_00 = (double *)malloc((long)j << 3);
  A_00 = (double *)malloc((long)j << 3);
  P_00 = (double *)malloc((long)N << 3);
  V_00 = (double *)malloc((long)N << 3);
  for (np = 0; np < j; np = np + 1) {
    phi_00[np] = 0.0;
    theta_00[np] = 0.0;
  }
  for (np = 0; np < ps; np = np + 1) {
    phi_00[np] = pdStack_38[np];
  }
  for (np = 0; np < qs; np = np + 1) {
    theta_00[np] = pdStack_38[np + ps];
  }
  for (ifault = 0; ifault < s; ifault = ifault + 1) {
    iVar2 = (ifault + 1) * naram + -1;
    phi_00[iVar2] = pdStack_38[ps + qs + ifault] + phi_00[iVar2];
    for (np = 0; np < ps; np = np + 1) {
      iVar2 = (ifault + 1) * naram + np;
      phi_00[iVar2] = -pdStack_38[np] * pdStack_38[ps + qs + ifault] + phi_00[iVar2];
    }
  }
  for (ifault = 0; ifault < offset; ifault = ifault + 1) {
    iVar2 = (ifault + 1) * naram + -1;
    theta_00[iVar2] = pdStack_38[ps + qs + s + ifault] + theta_00[iVar2];
    for (np = 0; np < qs; np = np + 1) {
      iVar2 = (ifault + 1) * naram + np;
      theta_00[iVar2] = pdStack_38[np + ps] * pdStack_38[ps + qs + s + ifault] + theta_00[iVar2];
    }
  }
  if (0 < *(int *)((long)params + 0x2c)) {
    for (np = 0; np < nit; np = np + 1) {
      _q = *(double *)((long)params + (long)(M + nit * 2 + np) * 8 + 0x58);
      for (ifault = 0; ifault < iq; ifault = ifault + 1) {
        _q = -*(double *)((long)params + (long)(ifault * nit + np) * 8 + (long)iVar1 * 8 + 0x58) *
             pdStack_38[ip + ifault] + _q;
      }
      *(double *)((long)params + (long)(M + np) * 8 + 0x58) = _q;
    }
  }
  iter = 0;
  if (((ir == 1) && (i == 0)) || ((ir == 0 && (i == 0)))) {
    *V_00 = 1.0;
    *A_00 = 0.0;
    *P_00 = 1.0 / (-*phi_00 * *phi_00 + 1.0);
  }
  else {
    iter = 1;
    iupd = starma(ir,i,phi_00,theta_00,A_00,P_00,V_00);
  }
  local_b8 = 0;
  temp = 0.001;
  karma(ir,i,phi_00,theta_00,A_00,P_00,V_00,nit,(double *)((long)params + (long)M * 8 + 0x58),
        (double *)((long)params + (long)nit * 8 + (long)M * 8 + 0x58),&delta,&sumlog,iter,0.001,
        (int *)((long)&phi + 4),&local_b8);
  *(double *)((long)params + 0x40) = sumlog;
  dVar3 = delta / (double)phi._4_4_;
  dVar4 = log(sumlog / (double)phi._4_4_);
  ssq = (dVar3 + dVar4) * 0.5;
  *(double *)((long)params + 0x48) = ssq;
  free(phi_00);
  free(theta_00);
  free(A_00);
  free(P_00);
  free(V_00);
  return ssq;
}

Assistant:

double fas154x_seas(double *b, int pq, void *params) {
	double value, ssq, sumlog, delta,temp;
	int p, q, ps, qs,s,offset,naram,M;
	int ip, iq, ir, i,j, np, ifault, N, iupd, nit, iter;
	double *phi, *theta, *A, *P, *V,*reg;

	value = ssq = sumlog = 0.0;
	xlik_object obj = (xlik_object)params;

	ip = obj->p + (obj->s * obj->P);
	iq = obj->q + (obj->s * obj->Q);
	ir = obj->r;
	N = obj->N;
	p = obj->p;
	ps = obj->P;
	q = obj->q;
	qs = obj->Q;
	M = obj->M;
	s = obj->s;
	offset = obj->offset;
	np = (ir * (ir + 1)) / 2;
	naram = p + q + ps + qs;
	reg = &obj->x[offset+3*N];
	//mdisplay(reg,M,N);

	phi = (double*)malloc(sizeof(double)* ir);
	theta = (double*)malloc(sizeof(double)* ir);
	A = (double*)malloc(sizeof(double)* ir);
	P = (double*)malloc(sizeof(double)* np);
	V = (double*)malloc(sizeof(double)* np);

	for (i = 0; i < ir; ++i) {
		phi[i] = 0.0;
		theta[i] = 0.0;
	}

	for (i = 0; i < p; ++i) {
		phi[i] = b[i];
	}

	for (i = 0; i < q; ++i) {
		theta[i] = b[i + p];
	}
	
	/*
	for (i = p; i < ip; ++i) {
		phi[i] = 0.0;
	}

	for (i = q; i < iq; ++i) {
		theta[i] = 0.0;
	}
	*/

	for (j = 0; j < ps; ++j) {
		phi[(j + 1)*s - 1] += b[p + q + j];
		for (i = 0; i < p; ++i) {
			phi[(j + 1)*s + i] -= b[i] * b[p + q + j];
		}
	}

	for (j = 0; j < qs; ++j) {
		theta[(j + 1)*s - 1] += b[p + q + ps + j];
		for (i = 0; i < q; ++i) {
			theta[(j + 1)*s + i] += b[i + p] * b[p + q + ps + j];
		}
	}
	
	/*
	if (obj->M == 1) {
		for (i = 0; i < N; ++i) {
			obj->x[offset + i] = obj->x[offset + 2 * N + i] - b[p + q + ps + qs];
		}
	}
	*/

	if (obj->M > 0) {
		for (i = 0; i < N; ++i) {
			temp = obj->x[offset + 2 * N + i];
			for(j = 0; j < M;++j) {
				temp -= reg[j*N+i]*b[naram+j];
			}
			obj->x[offset + i] = temp;
		}
	}
	
	iupd = 0;

	if ((ip == 1 && iq == 0) || (ip == 0 && iq == 0)) {
		*V = 1.0;
		*A = 0.0;
		*P = 1.0 / (1.0 - phi[0] * phi[0]);
	}
	else {
		iupd = 1;
		ifault = starma(ip, iq, phi, theta, A, P, V);
	}

	nit = 0;
	delta = 0.001;
	//mdisplay(P, 1, np);
	karma(ip, iq, phi, theta, A, P, V, N, obj->x + offset, obj->x + offset + N, &sumlog, &ssq, iupd, delta, &iter, &nit);
	obj->ssq = ssq;
	//mdisplay(V, 1, np);

	value = 0.5 * (sumlog / (double)iter + log(ssq / (double)iter));
	obj->loglik = value;
	//printf("sumlog ssq %g %g %d \n", sumlog,value,iter);

	free(phi);
	free(theta);
	free(A);
	free(P);
	free(V);
	return value;
}